

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdNegl(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG(&ctx->ctx,o_neg64,reg1);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,reg1);
  return;
}

Assistant:

void GenCodeCmdNegl(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg lhsReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, lhsReg, sQWORD, rREG, cmd.rC * 8); // Load long value

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG(ctx.ctx, o_neg64, lhsReg);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, lhsReg); // Store long to target
#else
	// Load long value into EAX:EDX
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rC * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8 + 4);

	// Load 'zero' into ECX:EDI
	EMIT_OP_REG_REG(ctx.ctx, o_xor, rECX, rECX);
	EMIT_OP_REG_REG(ctx.ctx, o_xor, rEDI, rEDI);

	EMIT_OP_REG_REG(ctx.ctx, o_sub, rECX, rEAX);
	EMIT_REG_READ(ctx.ctx, rECX); // sbb implicitly reads the result of the last value-producing instruction
	EMIT_OP_REG_REG(ctx.ctx, o_sbb, rEDI, rEDX);

	// Store long in ECX:EDI to target
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rECX);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDI);
#endif
}